

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O3

int __thiscall itis::AVLTree<int>::find(AVLTree<int> *this,int value)

{
  int iVar1;
  AVLTreeNode<int> *pAVar2;
  AVLTreeNode<int> *pAVar3;
  int iVar4;
  
  pAVar2 = this->root;
  if (pAVar2 != (AVLTreeNode<int> *)0x0) {
    iVar1 = 0;
    do {
      if (pAVar2->value == value) {
        if (pAVar2->left == (AVLTreeNode<int> *)0x0) {
          iVar4 = 0;
        }
        else {
          iVar4 = pAVar2->left->count;
        }
        return iVar4 + iVar1;
      }
      pAVar3 = (AVLTreeNode<int> *)&pAVar2->left;
      if (pAVar2->value <= value) {
        if (*(AVLTreeNode<int> **)pAVar3 == (AVLTreeNode<int> *)0x0) {
          iVar4 = 1;
        }
        else {
          iVar4 = (*(AVLTreeNode<int> **)pAVar3)->count + 1;
        }
        iVar1 = iVar1 + iVar4;
        pAVar3 = pAVar2;
      }
      pAVar2 = pAVar3->right;
    } while (pAVar2 != (AVLTreeNode<int> *)0x0);
  }
  return -1;
}

Assistant:

int AVLTree<T>::find(T value) const {
    AVLTreeNode<T> *direct = root;
    int idx = 0;

    while (direct != nullptr and direct->value != value) {
      if (direct->value > value) {
        direct = direct->left;
      } else {
        idx += (direct->left ? direct->left->count : 0) + 1;
        direct = direct->right;
      }
    }

    if (direct == nullptr) {
      return -1;
    }
    return idx + (direct->left ? direct->left->count : 0);
  }